

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quoted.cpp
# Opt level: O0

void __thiscall Quoted_Simple_Test::TestBody(Quoted_Simple_Test *this)

{
  bool bVar1;
  char *message;
  _Quoted_string<const_char_*,_char> _Var2;
  AssertHelper local_208;
  Message local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  char local_1c0;
  char cStack_1bf;
  _Quoted_string<const_char_*,_char> local_1a8;
  stringstream local_198 [8];
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_188 [376];
  Quoted_Simple_Test *local_10;
  Quoted_Simple_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  _Var2 = pstore::quoted("simple");
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )_Var2._M_string;
  _local_1c0 = _Var2._8_2_;
  local_1a8._M_delim = local_1c0;
  local_1a8._M_escape = cStack_1bf;
  local_1a8._M_string =
       (char *)gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  std::__detail::operator<<(local_188,&local_1a8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_1d8,"str.str ()","R\"(\"simple\")\"",&local_1f8,
             (char (*) [9])"\"simple\"");
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_quoted.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST (Quoted, Simple) {
    std::stringstream str;
    str << pstore::quoted ("simple");
    EXPECT_EQ (str.str (), R"("simple")");
}